

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_base.c
# Opt level: O0

int lj_cf_unpack(lua_State *L)

{
  cTValue *pcVar1;
  long lVar2;
  bool bVar3;
  MSize MVar4;
  int iVar5;
  GCtab *t_00;
  cTValue *pcVar6;
  long in_RDI;
  cTValue *tv;
  uint32_t nu;
  int32_t e;
  int32_t i;
  int32_t n;
  GCtab *t;
  ErrMsg in_stack_ffffffffffffff8c;
  lua_State *in_stack_ffffffffffffff90;
  int32_t in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  lua_State *in_stack_ffffffffffffffa0;
  uint local_50;
  int local_34;
  
  t_00 = lj_lib_checktab(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
  local_50 = lj_lib_optint(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,
                           in_stack_ffffffffffffff98);
  if ((*(long *)(in_RDI + 0x10) + 0x10U < *(ulong *)(in_RDI + 0x18)) &&
     (*(int *)(*(long *)(in_RDI + 0x10) + 0x14) != -1)) {
    MVar4 = lj_lib_checkint((lua_State *)
                            CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                            (int)((ulong)in_stack_ffffffffffffff90 >> 0x20));
  }
  else {
    MVar4 = lj_tab_len((GCtab *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  }
  if ((int)MVar4 < (int)local_50) {
    local_34 = 0;
  }
  else {
    local_34 = (MVar4 - local_50) + 1;
    if ((7999 < MVar4 - local_50) ||
       (iVar5 = lua_checkstack(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c), iVar5 == 0)) {
      lj_err_caller(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
    }
    do {
      if (local_50 < t_00->asize) {
        pcVar6 = (cTValue *)((ulong)(t_00->array).ptr32 + (long)(int)local_50 * 8);
      }
      else {
        pcVar6 = lj_tab_getinth(t_00,local_50);
      }
      if (pcVar6 == (cTValue *)0x0) {
        lVar2 = *(long *)(in_RDI + 0x18);
        *(long *)(in_RDI + 0x18) = lVar2 + 8;
        *(undefined4 *)(lVar2 + 4) = 0xffffffff;
      }
      else {
        pcVar1 = *(cTValue **)(in_RDI + 0x18);
        *(cTValue **)(in_RDI + 0x18) = pcVar1 + 1;
        *pcVar1 = *pcVar6;
      }
      bVar3 = (int)local_50 < (int)MVar4;
      local_50 = local_50 + 1;
    } while (bVar3);
  }
  return local_34;
}

Assistant:

LJLIB_CF(unpack)
{
  GCtab *t = lj_lib_checktab(L, 1);
  int32_t n, i = lj_lib_optint(L, 2, 1);
  int32_t e = (L->base+3-1 < L->top && !tvisnil(L->base+3-1)) ?
	      lj_lib_checkint(L, 3) : (int32_t)lj_tab_len(t);
  uint32_t nu;
  if (i > e) return 0;
  nu = (uint32_t)e - (uint32_t)i;
  n = (int32_t)(nu+1);
  if (nu >= LUAI_MAXCSTACK || !lua_checkstack(L, n))
    lj_err_caller(L, LJ_ERR_UNPACK);
  do {
    cTValue *tv = lj_tab_getint(t, i);
    if (tv) {
      copyTV(L, L->top++, tv);
    } else {
      setnilV(L->top++);
    }
  } while (i++ < e);
  return n;
}